

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O0

void __thiscall
QCommandLineParser::addPositionalArgument
          (QCommandLineParser *this,QString *name,QString *description,QString *syntax)

{
  bool bVar1;
  PositionalArgumentDefinition *in_RCX;
  PositionalArgumentDefinition *in_RSI;
  long in_FS_OFFSET;
  PositionalArgumentDefinition arg;
  QString *in_stack_ffffffffffffff78;
  PositionalArgumentDefinition *in_stack_ffffffffffffff80;
  PositionalArgumentDefinition local_50;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_50,0xaa,0x48);
  QCommandLineParserPrivate::PositionalArgumentDefinition::PositionalArgumentDefinition
            (in_stack_ffffffffffffff80);
  QString::operator=(&in_stack_ffffffffffffff80->name,in_stack_ffffffffffffff78);
  QString::operator=(&in_stack_ffffffffffffff80->name,in_stack_ffffffffffffff78);
  bVar1 = QString::isEmpty((QString *)0x1f9f54);
  if (!bVar1) {
    in_RSI = in_RCX;
  }
  QString::operator=(&in_RSI->name,in_stack_ffffffffffffff78);
  QList<QCommandLineParserPrivate::PositionalArgumentDefinition>::append
            ((QList<QCommandLineParserPrivate::PositionalArgumentDefinition> *)in_RSI,&local_50);
  QCommandLineParserPrivate::PositionalArgumentDefinition::~PositionalArgumentDefinition(in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCommandLineParser::addPositionalArgument(const QString &name, const QString &description, const QString &syntax)
{
    QCommandLineParserPrivate::PositionalArgumentDefinition arg;
    arg.name = name;
    arg.description = description;
    arg.syntax = syntax.isEmpty() ? name : syntax;
    d->positionalArgumentDefinitions.append(arg);
}